

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O1

void __thiscall libwebm::TempFileDeleter::~TempFileDeleter(TempFileDeleter *this)

{
  pointer pcVar1;
  ifstream file;
  long local_210 [4];
  int aiStack_1f0 [122];
  
  std::ifstream::ifstream(local_210,(this->file_name_)._M_dataplus._M_p,_S_in);
  if (*(int *)((long)aiStack_1f0 + *(long *)(local_210[0] + -0x18)) == 0) {
    std::ifstream::close();
    remove((this->file_name_)._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_210);
  pcVar1 = (this->file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_name_).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

TempFileDeleter::~TempFileDeleter() {
  std::ifstream file(file_name_.c_str());
  if (file.good()) {
    file.close();
    std::remove(file_name_.c_str());
  }
}